

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O2

cl_int xmrig::OclLib::release(cl_command_queue command_queue)

{
  cl_int ret;
  char *pcVar1;
  cl_int cVar2;
  
  cVar2 = 0;
  if (command_queue != (cl_command_queue)0x0) {
    finish(command_queue);
    ret = (*pReleaseCommandQueue)(command_queue);
    if (ret != 0) {
      pcVar1 = OclError::toString(ret);
      Log::print(ERR,
                 "\x1b[45;1m\x1b[1;37m ocl \x1b[0m\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31m%s\x1b[0m"
                 ,pcVar1,"clReleaseCommandQueue");
      cVar2 = ret;
    }
  }
  return cVar2;
}

Assistant:

cl_int xmrig::OclLib::release(cl_command_queue command_queue) noexcept
{
    assert(pReleaseCommandQueue != nullptr);
    assert(pGetCommandQueueInfo != nullptr);

    if (command_queue == nullptr) {
        return CL_SUCCESS;
    }

    LOG_REFS("%p %u ~queue", command_queue, getUint(command_queue, CL_QUEUE_REFERENCE_COUNT));

    finish(command_queue);

    cl_int ret = pReleaseCommandQueue(command_queue);
    if (ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(ret), kReleaseCommandQueue);
    }

    return ret;
}